

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O3

uint32_t * createDFDDepthStencil(int depthBits,int stencilBits,int sizeBytes)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  iVar7 = (uint)(0 < stencilBits) + (uint)(0 < depthBits);
  uVar8 = iVar7 * 0x10 + 0x1c;
  puVar2 = (uint32_t *)malloc((ulong)uVar8);
  *puVar2 = uVar8;
  puVar2[1] = 0;
  puVar2[2] = iVar7 * 0x100000 + 0x180002;
  puVar2[3] = 0x10001;
  puVar2[4] = 0;
  puVar2[5] = sizeBytes;
  puVar2[6] = 0;
  if (stencilBits == 8 && depthBits == 0x18) {
    puVar2[7] = 0xd070000;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 1;
    puVar2[0xb] = 0xe170008;
    uVar3 = 0xffffff;
  }
  else {
    if (depthBits == 0x20) {
      puVar2[7] = 0xce1f0000;
      puVar2[8] = 0;
      puVar2[9] = 0xbf800000;
      puVar2[10] = 0x3f800000;
    }
    else {
      if (depthBits < 1) {
        if (stencilBits < 1) {
          return puVar2;
        }
        puVar2[7] = stencilBits * 0x10000 - 0x10000U | 0xd000000;
        uVar3 = 1;
        lVar4 = 0x28;
        lVar5 = 0x24;
        lVar6 = 0x20;
        goto LAB_001e01b3;
      }
      uVar1 = ~(-1 << ((byte)depthBits & 0x1f));
      if (0x20 < (uint)depthBits) {
        uVar1 = 0xffffffff;
      }
      puVar2[7] = depthBits * 0x10000 - 0x10000U | 0xe000000;
      puVar2[8] = 0;
      puVar2[9] = 0;
      puVar2[10] = uVar1;
    }
    if (stencilBits < 1) {
      return puVar2;
    }
    puVar2[0xb] = stencilBits * 0x10000 - 0x10000U | depthBits | 0xd000000;
    uVar3 = 1;
  }
  lVar4 = 0x38;
  lVar5 = 0x34;
  lVar6 = 0x30;
LAB_001e01b3:
  *(undefined4 *)((long)puVar2 + lVar6) = 0;
  *(undefined4 *)((long)puVar2 + lVar5) = 0;
  *(undefined4 *)((long)puVar2 + lVar4) = uVar3;
  return puVar2;
}

Assistant:

uint32_t *createDFDDepthStencil(int depthBits,
                                int stencilBits,
                                int sizeBytes)
{
    /* N.B. Little-endian is assumed. */
    uint32_t *DFD = 0;
    DFD = writeHeader((depthBits > 0) + (stencilBits > 0),
                      sizeBytes, s_UNORM, i_NON_COLOR);

    /* Handle the special case of D24_UNORM_S8_UINT where the order of the
       channels is flipped by putting stencil in the LSBs. */
    if (depthBits == 24 && stencilBits == 8) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                    8, 0,
                    1, 1, s_UINT);
        writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    24, 8,
                    1, 1, s_UNORM);
        return DFD;
    }

    if (depthBits == 32) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    32, 0,
                    1, 1, s_SFLOAT);
    } else if (depthBits > 0) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    depthBits, 0,
                    1, 1, s_UNORM);
    }
    if (stencilBits > 0) {
        if (depthBits > 0) {
            writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, depthBits,
                        1, 1, s_UINT);
        } else {
            writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, 0,
                        1, 1, s_UINT);
        }
    }
    return DFD;
}